

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvRestore(CVodeMem cv_mem,sunrealtype saved_t)

{
  long in_RDI;
  undefined8 in_XMM0_Qa;
  int k;
  int j;
  undefined4 local_18;
  undefined4 local_14;
  
  *(undefined8 *)(in_RDI + 0x168) = in_XMM0_Qa;
  for (local_18 = 1; local_18 <= *(int *)(in_RDI + 0x120); local_18 = local_18 + 1) {
    for (local_14 = *(int *)(in_RDI + 0x120); local_18 <= local_14; local_14 = local_14 + -1) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                   *(undefined8 *)(in_RDI + 0x60 + (long)(local_14 + -1) * 8),
                   *(undefined8 *)(in_RDI + 0x60 + (long)local_14 * 8),
                   *(undefined8 *)(in_RDI + 0x60 + (long)(local_14 + -1) * 8));
    }
  }
  return;
}

Assistant:

void cvRestore(CVodeMem cv_mem, sunrealtype saved_t)
{
  int j, k;

  cv_mem->cv_tn = saved_t;
  for (k = 1; k <= cv_mem->cv_q; k++)
  {
    for (j = cv_mem->cv_q; j >= k; j--)
    {
      N_VLinearSum(ONE, cv_mem->cv_zn[j - 1], -ONE, cv_mem->cv_zn[j],
                   cv_mem->cv_zn[j - 1]);
    }
  }
}